

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O2

int amqp_open_socket_inner(char *hostname,int portnumber,amqp_time_t deadline)

{
  addrinfo *paVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  addrinfo **__pai;
  int one;
  socklen_t local_b0;
  int result;
  amqp_time_t local_a8;
  addrinfo *address_list;
  char portnumber_string [33];
  addrinfo local_68;
  
  local_68.ai_flags = 0;
  local_68.ai_family = 0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_socktype = 1;
  local_68.ai_protocol = 6;
  sprintf(portnumber_string,"%d",portnumber);
  __pai = (addrinfo **)&address_list;
  iVar3 = getaddrinfo(hostname,portnumber_string,&local_68,__pai);
  if (iVar3 == 0) {
    iVar3 = -1;
    local_a8.time_point_ns = deadline.time_point_ns;
    do {
      paVar1 = *__pai;
      if (paVar1 == (addrinfo *)0x0) {
LAB_00108960:
        bVar2 = false;
        iVar6 = 0;
        goto LAB_0010896e;
      }
      one = 1;
      iVar3 = socket(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
      iVar6 = -9;
      if (iVar3 != -1) {
        uVar4 = fcntl(iVar3,1);
        iVar6 = -9;
        if (uVar4 != 0xffffffff) {
          iVar5 = fcntl(iVar3,2,(long)(int)(uVar4 | 1));
          iVar6 = -9;
          if (iVar5 != -1) {
            uVar4 = fcntl(iVar3,3);
            iVar6 = -9;
            if (uVar4 != 0xffffffff) {
              iVar5 = fcntl(iVar3,4,(long)(int)(uVar4 | 0x800));
              iVar6 = -9;
              if (iVar5 != -1) {
                iVar5 = setsockopt(iVar3,6,1,&one,4);
                iVar6 = -9;
                if (iVar5 == 0) {
                  iVar5 = setsockopt(iVar3,1,9,&one,4);
                  iVar6 = -9;
                  if (iVar5 == 0) {
                    iVar6 = connect(iVar3,paVar1->ai_addr,paVar1->ai_addrlen);
                    if (iVar6 == 0) {
LAB_0010895b:
                      iVar6 = iVar3;
                      if (-1 < iVar3) goto LAB_00108960;
                      goto LAB_001088e1;
                    }
                    piVar7 = __errno_location();
                    iVar6 = -9;
                    if ((*piVar7 == 0x73) && (iVar6 = amqp_poll(iVar3,4,local_a8), iVar6 == 0)) {
                      local_b0 = 4;
                      iVar5 = getsockopt(iVar3,1,4,&result,&local_b0);
                      iVar6 = -9;
                      if ((iVar5 != -1) && (iVar6 = -9, result == 0)) goto LAB_0010895b;
                    }
                  }
                }
              }
            }
          }
        }
        close(iVar3);
      }
LAB_001088e1:
      iVar3 = iVar6;
      __pai = &paVar1->ai_next;
    } while (iVar3 != -0xd);
    bVar2 = true;
    iVar3 = -0xd;
    iVar6 = iVar3;
LAB_0010896e:
    freeaddrinfo((addrinfo *)address_list);
    if (iVar3 == -1) {
      iVar3 = iVar6;
    }
    if (bVar2) {
      iVar3 = iVar6;
    }
  }
  else {
    iVar3 = -5;
  }
  return iVar3;
}

Assistant:

int amqp_open_socket_inner(char const *hostname, int portnumber,
                           amqp_time_t deadline) {
  struct addrinfo hint;
  struct addrinfo *address_list;
  struct addrinfo *addr;
  char portnumber_string[33];
  int sockfd = -1;
  int last_error;

  last_error = amqp_os_socket_init();
  if (AMQP_STATUS_OK != last_error) {
    return last_error;
  }

  memset(&hint, 0, sizeof(hint));
  hint.ai_family = PF_UNSPEC; /* PF_INET or PF_INET6 */
  hint.ai_socktype = SOCK_STREAM;
  hint.ai_protocol = IPPROTO_TCP;

  (void)sprintf(portnumber_string, "%d", portnumber);

  last_error = getaddrinfo(hostname, portnumber_string, &hint, &address_list);
  if (0 != last_error) {
    return AMQP_STATUS_HOSTNAME_RESOLUTION_FAILED;
  }

  for (addr = address_list; addr; addr = addr->ai_next) {
    sockfd = connect_socket(addr, deadline);

    if (sockfd >= 0) {
      last_error = AMQP_STATUS_OK;
      break;
    } else if (sockfd == AMQP_STATUS_TIMEOUT) {
      last_error = sockfd;
      break;
    }
  }

  freeaddrinfo(address_list);
  if (last_error != AMQP_STATUS_OK || sockfd == -1) {
    return last_error;
  }
  return sockfd;
}